

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_recomputeRangeTypesRational(SoPlexBase<double> *this)

{
  int iVar1;
  RangeType RVar2;
  int iVar3;
  RangeType *pRVar4;
  SoPlexBase<double> *this_00;
  long in_RDI;
  int i_1;
  int i;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_ffffffffffffffb8;
  int i_00;
  RangeType in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  SoPlexBase<double> *in_stack_ffffffffffffffc8;
  undefined4 local_10;
  undefined4 local_c;
  
  numRowsRational((SoPlexBase<double> *)0x4527e6);
  DataArray<soplex::SoPlexBase<double>::RangeType>::reSize
            ((DataArray<soplex::SoPlexBase<double>::RangeType> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  local_c = 0;
  while( true ) {
    iVar1 = numRowsRational((SoPlexBase<double> *)0x45280c);
    if (iVar1 <= local_c) break;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    RVar2 = _rangeTypeRational(in_stack_ffffffffffffffc8,
                               (Rational *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffffb8);
    pRVar4 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       ((DataArray<soplex::SoPlexBase<double>::RangeType> *)(in_RDI + 0x4d50),
                        local_c);
    *pRVar4 = RVar2;
    local_c = local_c + 1;
  }
  this_00 = (SoPlexBase<double> *)(in_RDI + 0x4d38);
  numColsRational((SoPlexBase<double> *)0x4528a1);
  DataArray<soplex::SoPlexBase<double>::RangeType>::reSize
            ((DataArray<soplex::SoPlexBase<double>::RangeType> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  local_10 = 0;
  while( true ) {
    i_00 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    iVar1 = local_10;
    iVar3 = numColsRational((SoPlexBase<double> *)0x4528c7);
    if (iVar3 <= iVar1) break;
    in_stack_ffffffffffffffb8 =
         SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),i_00);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
            (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    in_stack_ffffffffffffffc0 =
         _rangeTypeRational(this_00,(Rational *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
    pRVar4 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       ((DataArray<soplex::SoPlexBase<double>::RangeType> *)(in_RDI + 0x4d38),
                        local_10);
    *pRVar4 = in_stack_ffffffffffffffc0;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_recomputeRangeTypesRational()
{
   _rowTypes.reSize(numRowsRational());

   for(int i = 0; i < numRowsRational(); i++)
      _rowTypes[i] = _rangeTypeRational(_rationalLP->lhs(i), _rationalLP->rhs(i));

   _colTypes.reSize(numColsRational());

   for(int i = 0; i < numColsRational(); i++)
      _colTypes[i] = _rangeTypeRational(_rationalLP->lower(i), _rationalLP->upper(i));
}